

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrend1.c
# Opt level: O1

FT_Error ft_raster1_transform
                   (FT_Renderer_conflict render,FT_GlyphSlot slot,FT_Matrix *matrix,FT_Vector *delta
                   )

{
  FT_Error FVar1;
  
  FVar1 = 6;
  if (slot->format == render->glyph_format) {
    if (matrix != (FT_Matrix *)0x0) {
      FT_Outline_Transform(&slot->outline,matrix);
    }
    FVar1 = 0;
    if (delta != (FT_Vector *)0x0) {
      FT_Outline_Translate(&slot->outline,delta->x,delta->y);
      FVar1 = 0;
    }
  }
  return FVar1;
}

Assistant:

static FT_Error
  ft_raster1_transform( FT_Renderer       render,
                        FT_GlyphSlot      slot,
                        const FT_Matrix*  matrix,
                        const FT_Vector*  delta )
  {
    FT_Error error = FT_Err_Ok;


    if ( slot->format != render->glyph_format )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    if ( matrix )
      FT_Outline_Transform( &slot->outline, matrix );

    if ( delta )
      FT_Outline_Translate( &slot->outline, delta->x, delta->y );

  Exit:
    return error;
  }